

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

void Mvc_CoverCommonCube(Mvc_Cover_t *pCover,Mvc_Cube_t *pComCube)

{
  uint local_28;
  uint local_24;
  int _i__1;
  int _i_;
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pComCube_local;
  Mvc_Cover_t *pCover_local;
  
  if ((*(uint *)&pComCube->field_0x8 & 0xffffff) == 0) {
    pComCube->pData[0] =
         0xffffffff >> ((byte)((uint)*(undefined4 *)&pComCube->field_0x8 >> 0x18) & 0x1f);
  }
  else if ((*(uint *)&pComCube->field_0x8 & 0xffffff) == 1) {
    pComCube->pData[0] = 0xffffffff;
    *(uint *)&pComCube->field_0x14 =
         0xffffffff >> ((byte)((uint)*(undefined4 *)&pComCube->field_0x8 >> 0x18) & 0x1f);
  }
  else {
    pComCube->pData[*(uint *)&pComCube->field_0x8 & 0xffffff] =
         0xffffffff >> ((byte)((uint)*(undefined4 *)&pComCube->field_0x8 >> 0x18) & 0x1f);
    local_24 = *(uint *)&pComCube->field_0x8 & 0xffffff;
    while (local_24 = local_24 - 1, -1 < (int)local_24) {
      pComCube->pData[(int)local_24] = 0xffffffff;
    }
  }
  for (__i__1 = (pCover->lCubes).pHead; __i__1 != (Mvc_Cube_t *)0x0; __i__1 = __i__1->pNext) {
    if ((*(uint *)&pComCube->field_0x8 & 0xffffff) == 0) {
      pComCube->pData[0] = pComCube->pData[0] & __i__1->pData[0];
    }
    else if ((*(uint *)&pComCube->field_0x8 & 0xffffff) == 1) {
      pComCube->pData[0] = pComCube->pData[0] & __i__1->pData[0];
      *(uint *)&pComCube->field_0x14 = *(uint *)&pComCube->field_0x14 & *(uint *)&__i__1->field_0x14
      ;
    }
    else {
      for (local_28 = *(uint *)&pComCube->field_0x8 & 0xffffff; -1 < (int)local_28;
          local_28 = local_28 - 1) {
        pComCube->pData[(int)local_28] =
             pComCube->pData[(int)local_28] & __i__1->pData[(int)local_28];
      }
    }
  }
  return;
}

Assistant:

void Mvc_CoverCommonCube( Mvc_Cover_t * pCover, Mvc_Cube_t * pComCube )
{
    Mvc_Cube_t * pCube;
    // clean the support
    Mvc_CubeBitFill( pComCube );
    // collect the support
    Mvc_CoverForEachCube( pCover, pCube )
        Mvc_CubeBitAnd( pComCube, pComCube, pCube );
}